

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O1

int __thiscall Debugger::FuzzyMatchFileName(Debugger *this,string *chunkName,string *fileName)

{
  char cVar1;
  char cVar2;
  size_type sVar3;
  size_type sVar4;
  string *psVar5;
  pointer pcVar6;
  pointer pcVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  string *end;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  int local_54;
  
  sVar3 = chunkName->_M_string_length;
  sVar4 = fileName->_M_string_length;
  end = (this->manager->extNames).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  psVar5 = (this->manager->extNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (end == psVar5) {
    uVar15 = 0;
    uVar13 = 0;
  }
  else {
    uVar13 = 0;
    uVar15 = 0;
    do {
      bVar8 = EndWith(chunkName,end);
      if ((bVar8) && (uVar13 < end->_M_string_length)) {
        uVar13 = end->_M_string_length;
      }
      bVar8 = EndWith(fileName,end);
      if ((bVar8) && (uVar15 < end->_M_string_length)) {
        uVar15 = end->_M_string_length;
      }
      end = end + 1;
    } while (end != psVar5);
  }
  uVar15 = sVar4 - uVar15;
  uVar13 = sVar3 - uVar13;
  uVar16 = uVar13;
  if (uVar15 < uVar13) {
    uVar16 = uVar15;
  }
  local_54 = 1;
  if ((uint)uVar16 != 1) {
    pcVar6 = (chunkName->_M_dataplus)._M_p;
    pcVar7 = (fileName->_M_dataplus)._M_p;
    local_54 = 1;
    uVar14 = 1;
    do {
      lVar17 = uVar13 - (long)(int)uVar14;
      cVar1 = pcVar6[lVar17];
      cVar2 = pcVar7[uVar15 - (long)(int)uVar14];
      iVar12 = 0;
      if (cVar1 != cVar2) {
        iVar9 = tolower((int)cVar1);
        iVar10 = tolower((int)cVar2);
        iVar12 = 6;
        if (iVar9 != iVar10) {
          if ((cVar1 == '\\') || (cVar1 == '/')) {
            if ((cVar2 == '\\') || (cVar2 == '/')) {
              local_54 = local_54 + 1;
            }
            else {
              uVar15 = uVar15 + 1;
            }
          }
          else if (cVar1 == '.') {
            uVar18 = lVar17 + 1;
            if ((uVar18 < uVar13) && ((pcVar6[uVar18] == '\\' || (pcVar6[uVar18] == '/')))) {
              uVar11 = ~uVar14 + (int)uVar13;
              if ((int)uVar11 < 0) {
                iVar12 = 4;
              }
              else {
                if ((pcVar6[uVar11] != '\\') && (pcVar6[uVar11] != '/')) goto LAB_00148afa;
                uVar14 = uVar14 + 1;
                uVar15 = uVar15 + 2;
                iVar12 = 6;
              }
            }
            else {
LAB_00148afa:
              iVar12 = 4;
              local_54 = 0;
            }
          }
          else {
            iVar12 = 4;
            local_54 = 0;
          }
        }
      }
    } while (((iVar12 == 6) || (iVar12 == 0)) && (uVar14 = uVar14 + 1, uVar14 != (uint)uVar16));
  }
  return local_54;
}

Assistant:

int Debugger::FuzzyMatchFileName(const std::string &chunkName, const std::string &fileName) const {
	auto chunkSize = chunkName.size();
	auto fileSize = fileName.size();


	std::size_t chunkExtSize = 0;
	std::size_t fileExtSize = 0;
	// trim 掉后缀
	for (const auto &ext: manager->extNames) {
		if (EndWith(chunkName, ext)) {
			if (ext.size() > chunkExtSize) {
				chunkExtSize = ext.size();
			}
		}

		if (EndWith(fileName, ext)) {
			if (ext.size() > fileExtSize) {
				fileExtSize = ext.size();
			}
		}
	}

	chunkSize -= chunkExtSize;
	fileSize -= fileExtSize;

	// 我们用chunkname去匹配filename
	int maxMatchSize = static_cast<int>(std::min(chunkSize, fileSize));

	int matchProcess = 1;

	for (int i = 1; i != maxMatchSize; i++) {
		char cChar = chunkName[chunkSize - i];
		char fChar = fileName[fileSize - i];

		if (cChar != fChar) {
			// 以下匹配顺序是有意义的，不要轻易改变

			if (::tolower(cChar) == ::tolower(fChar)) {
				continue;
			}

			// 认为来自编辑器的路径不会是相对路径
			// chunkname有可能是(./aaaa)也可能是(aaa/./bbb)
			// 并不匹配(../)的情况
			// 因为 ../的路径意义并不唯一
			if (cChar == '.') {
				std::size_t cLastindex = chunkSize - i + 1;

				if (cLastindex >= chunkSize) {
					matchProcess = 0;
					break;
				}

				char cLastChar = chunkName[cLastindex];
				if (cLastChar != '/' && cLastChar != '\\') {
					matchProcess = 0;
					break;
				}

				// 该值可能为负数
				int cNextIndex = static_cast<int>(chunkSize) - i - 1;
				if (cNextIndex < 0) {
					// 匹配已经完毕
					break;
				}

				char cNextChar = chunkName[cNextIndex];

				// 那chunkname 就是 aaa./bbbb 那就不匹配
				if (cNextChar != '/' && cNextChar != '\\') {
					matchProcess = 0;
					break;
				}

				// 这里会消耗掉 next的匹配
				i++;

				// 这里是指保持下一次循环时fChar不变
				fileSize += 2;
				continue;
			}

			if (cChar == '/' || cChar == '\\') {
				if (fChar == '/' || fChar == '\\') {
					matchProcess++;
					continue;
				}
				// 一些人会写出 require './aaaa' 这种代码
				// 导致lua程序 的chunkname 给的是 .\\/aaaa.lua


				//保持fChar 下次循环时不变
				fileSize++;
				continue;
			}

			// 那就是不匹配
			matchProcess = 0;
			break;
		}
	}

	return matchProcess;
}